

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::TypeofElem_Int32(Var instance,int32 index,ScriptContext *scriptContext)

{
  BOOL BVar1;
  JavascriptString *pJVar2;
  Var pvVar3;
  
  BVar1 = IsNumberFromNativeArray(instance,index,scriptContext);
  if (BVar1 != 0) {
    pJVar2 = StringCache::GetNumberTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar2;
  }
  pvVar3 = TypeofElem(instance,(Var)((ulong)(uint)index | 0x1000000000000),scriptContext);
  return pvVar3;
}

Assistant:

Var JavascriptOperators::TypeofElem_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem_Int32);
        if (JavascriptOperators::IsNumberFromNativeArray(instance, index, scriptContext))
            return scriptContext->GetLibrary()->GetNumberTypeDisplayString();

#if FLOATVAR
        return TypeofElem(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return TypeofElem(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_TypeofElem_Int32);
    }